

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_sparse.hpp
# Opt level: O2

sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
* __thiscall
boost::numeric::ublas::
sparse_vector_element<boost::numeric::ublas::mapped_vector<double,boost::numeric::ublas::map_std<unsigned_long,double,std::allocator<std::pair<unsigned_long_const,double>>>>>
::operator+=(sparse_vector_element<boost::numeric::ublas::mapped_vector<double,boost::numeric::ublas::map_std<unsigned_long,double,std::allocator<std::pair<unsigned_long_const,double>>>>>
             *this,double *d)

{
  sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  ::get_d((sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
           *)this);
  *(double *)(this + 0x10) = *d + *(double *)(this + 0x10);
  sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  ::set((sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
         *)this,(value_type *)(this + 0x10));
  return (sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
          *)this;
}

Assistant:

BOOST_UBLAS_INLINE
        sparse_vector_element &operator += (const D &d) {
            get_d ();
            d_ += d;
            set (d_);
            return *this;
        }